

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore_test.cpp
# Opt level: O3

void __thiscall
SemaphoreTest_CtorZero_Test<GenericSemaphore>::TestBody
          (SemaphoreTest_CtorZero_Test<GenericSemaphore> *this)

{
  bool bVar1;
  condition_variable local_70 [48];
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::condition_variable::condition_variable(local_70);
    local_20 = 0;
    local_30 = 0;
    uStack_28 = 0;
    local_40 = 0;
    uStack_38 = 0;
    std::condition_variable::~condition_variable(local_70);
  }
  return;
}

Assistant:

TYPED_TEST(SemaphoreTest, CtorZero)
{
  using counting_semaphore = typename TypeParam::template counting_semaphore<1>;
  EXPECT_NO_THROW(counting_semaphore{0});
}